

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix_t SE3_Ry(float degree)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  Matrix_t MVar6;
  
  MVar6.pMatrix = (float *)malloc(0x40);
  if (MVar6.pMatrix == (float *)0x0) {
    printf("ERROR: Malloc failed!-08");
  }
  pfVar2 = MVar6.pMatrix;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      pfVar2[lVar3] = 0.0;
    }
    pfVar2 = pfVar2 + 4;
  }
  dVar4 = (double)((degree / 180.0) * 3.1415927);
  dVar5 = cos(dVar4);
  *MVar6.pMatrix = (float)dVar5;
  dVar5 = sin(dVar4);
  MVar6.pMatrix[2] = (float)dVar5;
  MVar6.pMatrix[5] = 1.0;
  dVar5 = sin(dVar4);
  MVar6.pMatrix[8] = -(float)dVar5;
  dVar4 = cos(dVar4);
  MVar6.pMatrix[10] = (float)dVar4;
  MVar6.pMatrix[0xf] = 1.0;
  MVar6.row = '\x04';
  MVar6.column = '\x04';
  MVar6._10_6_ = 0;
  return MVar6;
}

Assistant:

Matrix_t SE3_Ry(float degree)
{
	float rad = (float)(degree / 180.0 * PI);
	int i, j;
	Matrix_t temp;
	float *se_y = (float *)malloc(sizeof(float) * 4 * 4);
	if (se_y == NULL)
		printf("ERROR: Malloc failed!-08");
	for (i = 0; i < 4; i++)
		for (j = 0; j < 4; j++)
			*(se_y + i * 4 + j) = 0;
	*(se_y + 0 * 4 + 0) = (float)cos(rad);
	*(se_y + 0 * 4 + 2) = (float)sin(rad);
	*(se_y + 1 * 4 + 1) = 1;
	*(se_y + 2 * 4 + 0) = -(float)sin(rad);
	*(se_y + 2 * 4 + 2) = (float)cos(rad);
	*(se_y + 3 * 4 + 3) = 1;

	temp.pMatrix = se_y;
	temp.row = 4;
	temp.column = 4;

	return temp;
}